

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastpfor.h
# Opt level: O0

void __thiscall
FastPForLib::SimplePFor<FastPForLib::Simple8b<true>_>::getBestBFromData
          (SimplePFor<FastPForLib::Simple8b<true>_> *this,uint32_t *in,uint8_t *bestb,
          uint8_t *bestcexcept,uint8_t *maxb)

{
  byte bVar1;
  uint uVar2;
  uint32_t uVar3;
  uint uVar4;
  undefined1 *in_RCX;
  byte *in_RDX;
  long in_RSI;
  byte *in_R8;
  uint32_t thiscost;
  uint32_t b;
  uint32_t cexcept;
  uint32_t bestcost;
  uint32_t k_1;
  uint32_t k;
  uint32_t freqs [33];
  uint local_cc;
  int local_c8;
  uint local_c4;
  uint local_c0;
  uint local_bc;
  int aiStack_b8 [36];
  byte *local_28;
  undefined1 *local_20;
  byte *local_18;
  long local_10;
  
  for (local_bc = 0; local_bc < 0x21; local_bc = local_bc + 1) {
    aiStack_b8[local_bc] = 0;
  }
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  for (local_c0 = 0; local_c0 < 0x80; local_c0 = local_c0 + 1) {
    uVar3 = asmbits(*(uint32_t *)(local_10 + (ulong)local_c0 * 4));
    aiStack_b8[uVar3] = aiStack_b8[uVar3] + 1;
  }
  *local_18 = 0x20;
  while (aiStack_b8[*local_18] == 0) {
    *local_18 = *local_18 - 1;
  }
  *local_28 = *local_18;
  bVar1 = *local_18;
  local_c8 = 0;
  *local_20 = 0;
  local_c4 = (uint)bVar1 << 7;
  uVar2 = (uint)*local_18;
  while (local_cc = uVar2 - 1, local_cc < 0x20) {
    local_c8 = aiStack_b8[uVar2] + local_c8;
    uVar4 = local_c8 * 8 + local_c8 * (*local_28 - local_cc) + local_cc * 0x80;
    uVar2 = local_cc;
    if (uVar4 < local_c4) {
      *local_18 = (byte)local_cc;
      *local_20 = (char)local_c8;
      local_c4 = uVar4;
    }
  }
  return;
}

Assistant:

void getBestBFromData(const uint32_t *in, uint8_t &bestb,
                        uint8_t &bestcexcept, uint8_t &maxb) {
    uint32_t freqs[33];
    for (uint32_t k = 0; k <= 32; ++k)
      freqs[k] = 0;
    for (uint32_t k = 0; k < BlockSize; ++k) {
      freqs[asmbits(in[k])]++;
    }
    bestb = 32;
    while (freqs[bestb] == 0)
      bestb--;
    maxb = bestb;
    uint32_t bestcost = bestb * BlockSize;
    uint32_t cexcept = 0;
    bestcexcept = static_cast<uint8_t>(cexcept);
    for (uint32_t b = bestb - 1; b < 32; --b) {
      cexcept += freqs[b + 1];
      uint32_t thiscost =
          cexcept * overheadofeachexcept + cexcept * (maxb - b) + b * BlockSize;
      if (thiscost < bestcost) {
        bestcost = thiscost;
        bestb = static_cast<uint8_t>(b);
        bestcexcept = static_cast<uint8_t>(cexcept);
      }
    }
  }